

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningLocalDetectorTest_localDetectorIsTheOneSpecifiedInConstructor_Test::testBody
          (TEST_MemoryLeakWarningLocalDetectorTest_localDetectorIsTheOneSpecifiedInConstructor_Test
           *this)

{
  UtestShell *pUVar1;
  MemoryLeakDetector *pMVar2;
  TestTerminator *pTVar3;
  MemoryLeakWarningPlugin memoryLeakWarningPlugin;
  MemoryLeakDetector localDetector;
  SimpleString local_1300;
  MemoryLeakWarningPlugin local_12f0;
  MemoryLeakDetector local_12a8;
  
  MemoryLeakDetector::MemoryLeakDetector
            (&local_12a8,
             &(this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningLocalDetectorTest).dummy.
              super_MemoryLeakFailure);
  SimpleString::SimpleString(&local_1300,"TestMemoryLeakWarningPlugin");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin(&local_12f0,&local_1300,&local_12a8);
  SimpleString::~SimpleString(&local_1300);
  pUVar1 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getMemoryLeakDetector(&local_12f0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_12a8,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x36,pTVar3);
  MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(&local_12f0);
  MemoryLeakDetector::~MemoryLeakDetector(&local_12a8);
  return;
}

Assistant:

TEST(MemoryLeakWarningLocalDetectorTest, localDetectorIsTheOneSpecifiedInConstructor)
{
    MemoryLeakDetector localDetector(&dummy);
    MemoryLeakWarningPlugin memoryLeakWarningPlugin("TestMemoryLeakWarningPlugin", &localDetector);
    POINTERS_EQUAL(&localDetector, memoryLeakWarningPlugin.getMemoryLeakDetector());
}